

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_3::DepthRangeEvaluator::evaluate
          (DepthRangeEvaluator *this,ShaderEvalContext *c)

{
  DepthRangeParams DVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  DVar1 = *this->m_params;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = DVar1.zNear;
  auVar5._4_4_ = DVar1.zFar;
  auVar5 = minps(_DAT_00625830,auVar5);
  fVar3 = (float)(-(uint)(0.0 < DVar1.zNear) & auVar5._0_4_);
  fVar4 = (float)(-(uint)(0.0 < DVar1.zFar) & auVar5._4_4_);
  local_28 = CONCAT44(fVar4,fVar3);
  local_20 = (fVar4 - fVar3) * 0.5 + 0.5;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar2]] = afStack_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

void evaluate (gls::ShaderEvalContext& c)
	{
		float zNear	= deFloatClamp(m_params.zNear, 0.0f, 1.0f);
		float zFar	= deFloatClamp(m_params.zFar, 0.0f, 1.0f);
		float diff	= zFar - zNear;
		c.color.xyz() = tcu::Vec3(zNear, zFar, diff*0.5f + 0.5f);
	}